

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writebmp.cpp
# Opt level: O1

void writeBMP(char *filename,char *data,int W,int H)

{
  uint uVar1;
  FILE *__s;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  char h [54];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined2 local_58;
  int iStack_56;
  int iStack_52;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined6 uStack_40;
  undefined2 uStack_3a;
  undefined6 uStack_38;
  
  __s = fopen(filename,"wb");
  local_58 = 0;
  uStack_4d = 0;
  local_48 = 0;
  uStack_40 = 0;
  uStack_3a = 0;
  uStack_38 = 0;
  uStack_60 = 0x28000000360000;
  uStack_4e = 1;
  uStack_4c = 0x18;
  uVar1 = W * 3 + 3;
  uVar2 = W * 3 + 6;
  if (-1 < (int)uVar1) {
    uVar2 = uVar1;
  }
  local_68 = (ulong)CONCAT42((uVar2 >> 2) * H * 4 + 0x36,0x4d42);
  iStack_56 = W;
  iStack_52 = H;
  fwrite(&local_68,0x36,1,__s);
  if (H != 0) {
    uVar2 = W + 3;
    if (-1 < W) {
      uVar2 = W;
    }
    iVar6 = (H + -1) * W * 3;
    do {
      if (0 < W) {
        pcVar4 = data + iVar6;
        uVar5 = 0;
        do {
          lVar3 = 3;
          do {
            fputc((int)pcVar4[lVar3 + -1],__s);
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
          uVar5 = uVar5 + 1;
          pcVar4 = pcVar4 + 3;
        } while (uVar5 != (uint)W);
      }
      H = H + -1;
      fwrite((void *)((long)&uStack_4c + 2),1,(long)(int)(W - (uVar2 & 0xfffffffc)),__s);
      iVar6 = iVar6 + W * -3;
    } while (H != 0);
  }
  fclose(__s);
  return;
}

Assistant:

void writeBMP(const char* filename, char* data, int W, int H)
// data: RGB, top left -> bottom right, no padding
{
	FILE* fout = fopen(filename, "wb");
	char h[54] = "BM";
	h[10] = 54; // header size
	h[14] = 40; // info size
	h[26] = 1;
	h[28] = 24; // bit per pixel
	int size = 54 + (W*3+3)/4*4*H;
	memcpy(h+2, &size, 4);
	memcpy(h+18, &W, 4);
	memcpy(h+22, &H, 4);
	fwrite(h, 54, 1, fout);
	for (int y=H-1; ~y; --y) {
		for (int x=0; x<W; ++x)
			for (int k=2; ~k; --k) // RGB -> BGR
				fwrite(data+y*W*3+x*3+k, 1, 1, fout);
		// pad to 4n bytes per row
		fwrite(h+30, 1, W%4, fout);
	}
	fclose(fout);
}